

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

bool __thiscall
QSocks5Authenticator::unSeal(QSocks5Authenticator *this,QTcpSocket *sealedSocket,QByteArray *buf)

{
  long lVar1;
  bool bVar2;
  QSocks5Authenticator *in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QIODevice::readAll();
  bVar2 = unSeal(in_RDI,in_stack_ffffffffffffffa8,(QByteArray *)0x36f097);
  QByteArray::~QByteArray((QByteArray *)0x36f0a5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5Authenticator::unSeal(QTcpSocket *sealedSocket, QByteArray *buf)
{
    return unSeal(sealedSocket->readAll(), buf);
}